

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_remove(run_container_t *run,uint16_t pos)

{
  ushort uVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  uint uVar5;
  int32_t newlength;
  uint16_t newvalue;
  int32_t le_1;
  int32_t offset;
  int32_t le;
  int32_t index;
  uint16_t pos_local;
  run_container_t *run_local;
  
  iVar3 = interleavedBinarySearch(run->runs,run->n_runs,pos);
  if (-1 < iVar3) {
    if (run->runs[iVar3].length == 0) {
      recoverRoomAtIndex(run,(uint16_t)iVar3);
    }
    else {
      run->runs[iVar3].value = run->runs[iVar3].value + 1;
      run->runs[iVar3].length = run->runs[iVar3].length - 1;
    }
    return true;
  }
  iVar2 = -iVar3;
  iVar4 = iVar2 + -2;
  if (-1 < iVar4) {
    uVar5 = (uint)pos - (uint)run->runs[iVar4].value;
    uVar1 = run->runs[iVar4].length;
    if ((int)uVar5 < (int)(uint)uVar1) {
      run->runs[iVar4].length = (short)uVar5 - 1;
      makeRoomAtIndex(run,(short)iVar4 + 1);
      run->runs[iVar2 + -1].value = pos + 1;
      run->runs[iVar2 + -1].length = (uVar1 - (short)uVar5) - 1;
      return true;
    }
    if (uVar5 == uVar1) {
      run->runs[iVar4].length = run->runs[iVar4].length - 1;
      return true;
    }
  }
  return false;
}

Assistant:

static inline bool run_container_remove(run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) {
        int32_t le = run->runs[index].length;
        if (le == 0) {
            recoverRoomAtIndex(run, (uint16_t)index);
        } else {
            run->runs[index].value++;
            run->runs[index].length--;
        }
        return true;
    }
    index = -index - 2;  // points to preceding value, possibly -1
    if (index >= 0) {    // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset < le) {
            // need to break in two
            run->runs[index].length = (uint16_t)(offset - 1);
            // need to insert
            uint16_t newvalue = pos + 1;
            int32_t newlength = le - offset - 1;
            makeRoomAtIndex(run, (uint16_t)(index + 1));
            run->runs[index + 1].value = newvalue;
            run->runs[index + 1].length = (uint16_t)newlength;
            return true;

        } else if (offset == le) {
            run->runs[index].length--;
            return true;
        }
    }
    // no match
    return false;
}